

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

void __thiscall
icu_63::RBBIRuleScanner::findSetFor
          (RBBIRuleScanner *this,UnicodeString *s,RBBINode *node,UnicodeSet *setToAdopt)

{
  undefined8 uVar1;
  RBBISetTableEl *pRVar2;
  int8_t iVar3;
  uint start;
  UnicodeSet *pUVar4;
  RBBINode *pRVar5;
  UnicodeString *this_00;
  UnicodeString *local_100;
  RBBINode *local_f0;
  UnicodeSet *local_e0;
  UnicodeSet *local_d0;
  UnicodeString *tkey;
  RBBINode *usetNode;
  UChar32 c;
  undefined1 local_38 [16];
  RBBISetTableEl *el;
  UnicodeSet *setToAdopt_local;
  RBBINode *node_local;
  UnicodeString *s_local;
  RBBIRuleScanner *this_local;
  
  el = (RBBISetTableEl *)setToAdopt;
  setToAdopt_local = (UnicodeSet *)node;
  node_local = (RBBINode *)s;
  s_local = (UnicodeString *)this;
  local_38._8_8_ = uhash_get_63(this->fSetTable,s);
  pRVar5 = node_local;
  pRVar2 = el;
  if ((void *)local_38._8_8_ == (void *)0x0) {
    if (el == (RBBISetTableEl *)0x0) {
      s = (UnicodeString *)local_38;
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)s,L"any");
      iVar3 = icu_63::UnicodeString::compare((UnicodeString *)pRVar5,(ConstChar16Ptr *)s,-1);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)local_38);
      if (iVar3 == '\0') {
        pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)s);
        local_d0 = (UnicodeSet *)0x0;
        if (pUVar4 != (UnicodeSet *)0x0) {
          s = (UnicodeString *)0x0;
          UnicodeSet::UnicodeSet(pUVar4,0,0x10ffff);
          local_d0 = pUVar4;
        }
        el = (RBBISetTableEl *)local_d0;
      }
      else {
        s = (UnicodeString *)0x0;
        start = icu_63::UnicodeString::char32At((UnicodeString *)node_local,0);
        pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)s);
        local_e0 = (UnicodeSet *)0x0;
        if (pUVar4 != (UnicodeSet *)0x0) {
          s = (UnicodeString *)(ulong)start;
          UnicodeSet::UnicodeSet(pUVar4,start,start);
          local_e0 = pUVar4;
        }
        el = (RBBISetTableEl *)local_e0;
      }
    }
    pRVar5 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)s);
    local_f0 = (RBBINode *)0x0;
    if (pRVar5 != (RBBINode *)0x0) {
      RBBINode::RBBINode(pRVar5,uset);
      local_f0 = pRVar5;
    }
    if (local_f0 == (RBBINode *)0x0) {
      error(this,U_MEMORY_ALLOCATION_ERROR);
    }
    else {
      local_f0->fInputSet = (UnicodeSet *)el;
      local_f0->fParent = (RBBINode *)setToAdopt_local;
      *(RBBINode **)&setToAdopt_local->len = local_f0;
      icu_63::UnicodeString::operator=(&local_f0->fText,(UnicodeString *)node_local);
      pRVar5 = local_f0;
      UVector::addElement(this->fRB->fUSetNodes,local_f0,this->fRB->fStatus);
      local_38._8_8_ = uprv_malloc_63(0x10);
      this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pRVar5);
      local_100 = (UnicodeString *)0x0;
      if (this_00 != (UnicodeString *)0x0) {
        pRVar5 = node_local;
        icu_63::UnicodeString::UnicodeString(this_00,(UnicodeString *)node_local);
        local_100 = this_00;
      }
      if (((local_100 == (UnicodeString *)0x0) ||
          ((undefined8 *)local_38._8_8_ == (undefined8 *)0x0)) || (el == (RBBISetTableEl *)0x0)) {
        if (local_100 != (UnicodeString *)0x0) {
          (*(local_100->super_Replaceable).super_UObject._vptr_UObject[1])();
        }
        uprv_free_63((void *)local_38._8_8_);
        pRVar2 = el;
        local_38._8_8_ = 0;
        if (el != (RBBISetTableEl *)0x0) {
          UnicodeSet::~UnicodeSet((UnicodeSet *)el);
          UMemory::operator_delete((UMemory *)pRVar2,pRVar5);
        }
        el = (RBBISetTableEl *)0x0;
        error(this,U_MEMORY_ALLOCATION_ERROR);
      }
      else {
        *(UnicodeString **)local_38._8_8_ = local_100;
        *(RBBINode **)(local_38._8_8_ + 8) = local_f0;
        uhash_put_63(this->fSetTable,*(void **)local_38._8_8_,(void *)local_38._8_8_,
                     this->fRB->fStatus);
      }
    }
  }
  else {
    if (el != (RBBISetTableEl *)0x0) {
      UnicodeSet::~UnicodeSet((UnicodeSet *)el);
      UMemory::operator_delete((UMemory *)pRVar2,s);
    }
    uVar1 = *(undefined8 *)(local_38._8_8_ + 8);
    setToAdopt_local->len = (int)uVar1;
    setToAdopt_local->capacity = (int)((ulong)uVar1 >> 0x20);
  }
  return;
}

Assistant:

void RBBIRuleScanner::findSetFor(const UnicodeString &s, RBBINode *node, UnicodeSet *setToAdopt) {

    RBBISetTableEl   *el;

    // First check whether we've already cached a set for this string.
    // If so, just use the cached set in the new node.
    //   delete any set provided by the caller, since we own it.
    el = (RBBISetTableEl *)uhash_get(fSetTable, &s);
    if (el != NULL) {
        delete setToAdopt;
        node->fLeftChild = el->val;
        U_ASSERT(node->fLeftChild->fType == RBBINode::uset);
        return;
    }

    // Haven't seen this set before.
    // If the caller didn't provide us with a prebuilt set,
    //   create a new UnicodeSet now.
    if (setToAdopt == NULL) {
        if (s.compare(kAny, -1) == 0) {
            setToAdopt = new UnicodeSet(0x000000, 0x10ffff);
        } else {
            UChar32 c;
            c = s.char32At(0);
            setToAdopt = new UnicodeSet(c, c);
        }
    }

    //
    // Make a new uset node to refer to this UnicodeSet
    // This new uset node becomes the child of the caller's setReference node.
    //
    RBBINode *usetNode    = new RBBINode(RBBINode::uset);
    if (usetNode == NULL) {
        error(U_MEMORY_ALLOCATION_ERROR);
        return;
    }
    usetNode->fInputSet   = setToAdopt;
    usetNode->fParent     = node;
    node->fLeftChild      = usetNode;
    usetNode->fText = s;


    //
    // Add the new uset node to the list of all uset nodes.
    //
    fRB->fUSetNodes->addElement(usetNode, *fRB->fStatus);


    //
    // Add the new set to the set hash table.
    //
    el      = (RBBISetTableEl *)uprv_malloc(sizeof(RBBISetTableEl));
    UnicodeString *tkey = new UnicodeString(s);
    if (tkey == NULL || el == NULL || setToAdopt == NULL) {
        // Delete to avoid memory leak
        delete tkey;
        tkey = NULL;
        uprv_free(el);
        el = NULL;
        delete setToAdopt;
        setToAdopt = NULL;

        error(U_MEMORY_ALLOCATION_ERROR);
        return;
    }
    el->key = tkey;
    el->val = usetNode;
    uhash_put(fSetTable, el->key, el, fRB->fStatus);

    return;
}